

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

istream * Json::operator>>(istream *sin,Value *root)

{
  FILE *__stream;
  bool bVar1;
  undefined8 uVar2;
  runtime_error *this;
  istream *in_RDI;
  bool ok;
  Reader reader;
  Reader *in_stack_fffffffffffffe80;
  string *this_00;
  string local_158 [23];
  undefined1 in_stack_fffffffffffffebf;
  Reader *in_stack_fffffffffffffec0;
  istream *in_stack_fffffffffffffec8;
  Reader *in_stack_fffffffffffffed0;
  Reader *in_stack_ffffffffffffffe8;
  
  Reader::Reader(in_stack_fffffffffffffec0);
  bVar1 = Reader::parse(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                        (Value *)in_stack_fffffffffffffec0,(bool)in_stack_fffffffffffffebf);
  __stream = _stderr;
  if (!bVar1) {
    Reader::getFormattedErrorMessages_abi_cxx11_(in_stack_ffffffffffffffe8);
    this_00 = local_158;
    uVar2 = std::__cxx11::string::c_str();
    fprintf(__stream,"Error from reader: %s",uVar2);
    std::__cxx11::string::~string(this_00);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"reader error");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Reader::~Reader(in_stack_fffffffffffffe80);
  return in_RDI;
}

Assistant:

std::istream& operator>>(std::istream& sin, Value& root) {
  Json::Reader reader;
  bool ok = reader.parse(sin, root, true);
  if (!ok) {
    fprintf(stderr,
            "Error from reader: %s",
            reader.getFormattedErrorMessages().c_str());

    JSON_FAIL_MESSAGE("reader error");
  }
  return sin;
}